

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageSizeTests.cpp
# Opt level: O0

void __thiscall
vkt::image::anon_unknown_0::BufferSizeTestInstance::BufferSizeTestInstance
          (BufferSizeTestInstance *this,Context *context,Texture *texture,VkFormat format)

{
  PtrData<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> data;
  RefData<vk::Handle<(vk::HandleType)12>_> data_00;
  VkDeviceSize allocator_00;
  Allocator *pAVar1;
  VkDevice pVVar2;
  Buffer *pBVar3;
  VkBuffer *pVVar4;
  Buffer *in_stack_fffffffffffffe38;
  undefined8 in_stack_fffffffffffffe40;
  Move<vk::Handle<(vk::HandleType)12>_> local_108;
  RefData<vk::Handle<(vk::HandleType)12>_> local_e8;
  DefaultDeleter<vkt::image::Buffer> local_c5;
  deUint32 local_c4;
  VkBufferCreateInfo local_c0;
  PtrData<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> local_88;
  PtrData<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> *local_78;
  undefined1 local_64 [20];
  VkDeviceSize imageSizeBytes;
  Allocator *allocator;
  VkDevice device;
  DeviceInterface *vk;
  VkFormat local_24;
  Texture *pTStack_20;
  VkFormat format_local;
  Texture *texture_local;
  Context *context_local;
  BufferSizeTestInstance *this_local;
  
  local_24 = format;
  pTStack_20 = texture;
  texture_local = (Texture *)context;
  context_local = (Context *)this;
  SizeTestInstance::SizeTestInstance(&this->super_SizeTestInstance,context,texture,format);
  (this->super_SizeTestInstance).super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__BufferSizeTestInstance_016af9d8;
  de::details::MovePtr<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::MovePtr
            (&this->m_imageBuffer);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)12>_>::Move(&this->m_bufferView);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::Move(&this->m_descriptorSetLayout);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::Move(&this->m_descriptorPool);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::Move(&this->m_descriptorSet);
  device = (VkDevice)
           Context::getDeviceInterface((this->super_SizeTestInstance).super_TestInstance.m_context);
  allocator = (Allocator *)
              Context::getDevice((this->super_SizeTestInstance).super_TestInstance.m_context);
  imageSizeBytes =
       (VkDeviceSize)
       Context::getDefaultAllocator((this->super_SizeTestInstance).super_TestInstance.m_context);
  Texture::size((Texture *)local_64);
  local_64._12_8_ = getImageSizeBytes((IVec3 *)local_64,(this->super_SizeTestInstance).m_format);
  pBVar3 = (Buffer *)operator_new(0x30);
  pVVar2 = device;
  pAVar1 = allocator;
  allocator_00 = imageSizeBytes;
  makeBufferCreateInfo(&local_c0,local_64._12_8_,8);
  local_c4 = ::vk::MemoryRequirement::Any.m_flags;
  image::Buffer::Buffer
            (pBVar3,(DeviceInterface *)pVVar2,(VkDevice)pAVar1,(Allocator *)allocator_00,&local_c0,
             ::vk::MemoryRequirement::Any);
  de::DefaultDeleter<vkt::image::Buffer>::DefaultDeleter(&local_c5);
  de::details::MovePtr<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::MovePtr
            ((MovePtr<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> *)&local_88);
  local_78 = de::details::MovePtr::operator_cast_to_PtrData(&local_88,(MovePtr *)pBVar3);
  data._8_8_ = in_stack_fffffffffffffe40;
  data.ptr = in_stack_fffffffffffffe38;
  de::details::MovePtr<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::operator=
            (&this->m_imageBuffer,data);
  de::details::MovePtr<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::~MovePtr
            ((MovePtr<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> *)&local_88);
  pVVar2 = device;
  pAVar1 = allocator;
  pBVar3 = de::details::UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::
           operator->(&(this->m_imageBuffer).
                       super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>
                     );
  pVVar4 = image::Buffer::get(pBVar3);
  makeBufferView(&local_108,(DeviceInterface *)pVVar2,(VkDevice)pAVar1,(VkBuffer)pVVar4->m_internal,
                 (this->super_SizeTestInstance).m_format,0,local_64._12_8_);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_e8,(Move *)&local_108);
  data_00.deleter.m_deviceIface = local_e8.deleter.m_deviceIface;
  data_00.object.m_internal = local_e8.object.m_internal;
  data_00.deleter.m_device = local_e8.deleter.m_device;
  data_00.deleter.m_allocator = local_e8.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)12>_>::operator=(&this->m_bufferView,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)12>_>::~Move(&local_108);
  return;
}

Assistant:

BufferSizeTestInstance::BufferSizeTestInstance (Context& context, const Texture& texture, const VkFormat format)
	: SizeTestInstance	(context, texture, format)
{
	const DeviceInterface&	vk			= m_context.getDeviceInterface();
	const VkDevice			device		= m_context.getDevice();
	Allocator&				allocator	= m_context.getDefaultAllocator();

	// Create a texel storage buffer. Its data be uninitialized, as we're not reading from it.

	const VkDeviceSize imageSizeBytes = getImageSizeBytes(m_texture.size(), m_format);
	m_imageBuffer = de::MovePtr<Buffer>(new Buffer(vk, device, allocator,
		makeBufferCreateInfo(imageSizeBytes, VK_BUFFER_USAGE_STORAGE_TEXEL_BUFFER_BIT), MemoryRequirement::Any));

	m_bufferView = makeBufferView(vk, device, m_imageBuffer->get(), m_format, 0ull, imageSizeBytes);
}